

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::NewKey
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  Node *pNVar1;
  undefined7 uVar2;
  int iVar3;
  undefined4 uVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  hash_t hVar9;
  uint uVar10;
  uint uVar11;
  
  pNVar6 = this->Nodes;
  hVar9 = this->Size;
  do {
    uVar11 = hVar9 - 1 & key;
    pNVar1 = pNVar6 + uVar11;
    pNVar5 = pNVar1->Next;
    if (pNVar5 == (Node *)0x1) {
LAB_00464170:
      pNVar8 = (Node *)0x0;
      pNVar6 = pNVar1;
LAB_00464175:
      pNVar1->Next = pNVar8;
      this->NumUsed = this->NumUsed + 1;
      (pNVar6->Pair).Key = key;
      return pNVar6;
    }
    pNVar8 = this->LastFree;
    while (pNVar7 = pNVar8, pNVar8 = pNVar7 + -1, pNVar6 < pNVar7) {
      if (pNVar8->Next == (Node *)0x1) {
        this->LastFree = pNVar8;
        uVar10 = hVar9 - 1 & (pNVar1->Pair).Key;
        if (uVar10 != uVar11) {
          pNVar6 = pNVar6 + uVar10;
          do {
            pNVar5 = pNVar6;
            pNVar6 = pNVar5->Next;
          } while (pNVar6 != pNVar1);
          pNVar5->Next = pNVar8;
          uVar2 = *(undefined7 *)&(pNVar1->Pair).Value.field_0x11;
          pNVar7[-1].Pair.Value.mSorted = (pNVar1->Pair).Value.mSorted;
          *(undefined7 *)&pNVar7[-1].Pair.Value.field_0x11 = uVar2;
          pNVar6 = pNVar1->Next;
          iVar3 = (pNVar1->Pair).Key;
          uVar4 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
          uVar11 = (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most;
          uVar10 = (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count;
          pNVar7[-1].Pair.Value.super_TArray<FUDMFKey,_FUDMFKey>.Array =
               (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array;
          pNVar7[-1].Pair.Value.super_TArray<FUDMFKey,_FUDMFKey>.Most = uVar11;
          pNVar7[-1].Pair.Value.super_TArray<FUDMFKey,_FUDMFKey>.Count = uVar10;
          pNVar8->Next = pNVar6;
          pNVar7[-1].Pair.Key = iVar3;
          *(undefined4 *)&pNVar7[-1].Pair.field_0x4 = uVar4;
          goto LAB_00464170;
        }
        pNVar8->Next = pNVar5;
        pNVar6 = pNVar8;
        goto LAB_00464175;
      }
    }
    this->LastFree = pNVar8;
    Resize(this,hVar9 * 2);
    pNVar6 = this->Nodes;
    hVar9 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}